

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall icu_63::RBBITableBuilder::buildForwardTable(RBBITableBuilder *this)

{
  RBBINode **ppRVar1;
  UBool UVar2;
  RBBINode *pRVar3;
  RBBINode *this_00;
  RBBIRuleBuilder *pRVar4;
  void *in_RSI;
  
  if (U_ZERO_ERROR < *this->fStatus) {
    return;
  }
  if (*this->fTree == (RBBINode *)0x0) {
    return;
  }
  pRVar3 = RBBINode::flattenVariables(*this->fTree);
  *this->fTree = pRVar3;
  UVar2 = RBBISetBuilder::sawBOF(this->fRB->fSetBuilder);
  if (UVar2 == '\0') {
LAB_00289ddd:
    this_00 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)in_RSI);
    if (this_00 == (RBBINode *)0x0) {
      *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    in_RSI = (void *)0x8;
    RBBINode::RBBINode(this_00,opCat);
    pRVar3 = *this->fTree;
    this_00->fLeftChild = pRVar3;
    pRVar3->fParent = this_00;
    pRVar3 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)in_RSI);
    if (pRVar3 != (RBBINode *)0x0) {
      RBBINode::RBBINode(pRVar3,endMark);
      this_00->fRightChild = pRVar3;
      pRVar3->fParent = this_00;
      *this->fTree = this_00;
      RBBINode::flattenSets(*this->fTree);
      calcNullable(this,*this->fTree);
      calcFirstPos(this,*this->fTree);
      calcLastPos(this,*this->fTree);
      calcFollowPos(this,*this->fTree);
      pRVar4 = this->fRB;
      if (pRVar4->fChainRules != '\0') {
        calcChainedFollowPos(this,*this->fTree);
        pRVar4 = this->fRB;
      }
      UVar2 = RBBISetBuilder::sawBOF(pRVar4->fSetBuilder);
      if (UVar2 != '\0') {
        bofFixup(this);
      }
      buildStateTable(this);
      flagAcceptingStates(this);
      flagLookAheadStates(this);
      flagTaggedStates(this);
      mergeRuleStatusVals(this);
      return;
    }
    this_00->fRightChild = (RBBINode *)0x0;
    *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
    RBBINode::~RBBINode(this_00);
  }
  else {
    pRVar3 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)in_RSI);
    if (pRVar3 != (RBBINode *)0x0) {
      in_RSI = (void *)0x8;
      RBBINode::RBBINode(pRVar3,opCat);
    }
    this_00 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)in_RSI);
    if (this_00 == (RBBINode *)0x0) {
      *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
      if (pRVar3 != (RBBINode *)0x0) {
        RBBINode::~RBBINode(pRVar3);
      }
    }
    else {
      in_RSI = (void *)0x3;
      RBBINode::RBBINode(this_00,leafChar);
      if (pRVar3 != (RBBINode *)0x0) {
        pRVar3->fLeftChild = this_00;
        ppRVar1 = this->fTree;
        pRVar3->fRightChild = *ppRVar1;
        this_00->fParent = pRVar3;
        this_00->fVal = 2;
        *ppRVar1 = pRVar3;
        goto LAB_00289ddd;
      }
      *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    UMemory::operator_delete((UMemory *)pRVar3,in_RSI);
    if (this_00 != (RBBINode *)0x0) {
      RBBINode::~RBBINode(this_00);
    }
  }
  UMemory::operator_delete((UMemory *)this_00,in_RSI);
  return;
}

Assistant:

void  RBBITableBuilder::buildForwardTable() {

    if (U_FAILURE(*fStatus)) {
        return;
    }

    // If there were no rules, just return.  This situation can easily arise
    //   for the reverse rules.
    if (fTree==NULL) {
        return;
    }

    //
    // Walk through the tree, replacing any references to $variables with a copy of the
    //   parse tree for the substition expression.
    //
    fTree = fTree->flattenVariables();
#ifdef RBBI_DEBUG
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "ftree")) {
        RBBIDebugPuts("\nParse tree after flattening variable references.");
        RBBINode::printTree(fTree, TRUE);
    }
#endif

    //
    // If the rules contained any references to {bof} 
    //   add a {bof} <cat> <former root of tree> to the
    //   tree.  Means that all matches must start out with the 
    //   {bof} fake character.
    // 
    if (fRB->fSetBuilder->sawBOF()) {
        RBBINode *bofTop    = new RBBINode(RBBINode::opCat);
        RBBINode *bofLeaf   = new RBBINode(RBBINode::leafChar);
        // Delete and exit if memory allocation failed.
        if (bofTop == NULL || bofLeaf == NULL) {
            *fStatus = U_MEMORY_ALLOCATION_ERROR;
            delete bofTop;
            delete bofLeaf;
            return;
        }
        bofTop->fLeftChild  = bofLeaf;
        bofTop->fRightChild = fTree;
        bofLeaf->fParent    = bofTop;
        bofLeaf->fVal       = 2;      // Reserved value for {bof}.
        fTree               = bofTop;
    }

    //
    // Add a unique right-end marker to the expression.
    //   Appears as a cat-node, left child being the original tree,
    //   right child being the end marker.
    //
    RBBINode *cn = new RBBINode(RBBINode::opCat);
    // Exit if memory allocation failed.
    if (cn == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    cn->fLeftChild = fTree;
    fTree->fParent = cn;
    cn->fRightChild = new RBBINode(RBBINode::endMark);
    // Delete and exit if memory allocation failed.
    if (cn->fRightChild == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        delete cn;
        return;
    }
    cn->fRightChild->fParent = cn;
    fTree = cn;

    //
    //  Replace all references to UnicodeSets with the tree for the equivalent
    //      expression.
    //
    fTree->flattenSets();
#ifdef RBBI_DEBUG
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "stree")) {
        RBBIDebugPuts("\nParse tree after flattening Unicode Set references.");
        RBBINode::printTree(fTree, TRUE);
    }
#endif


    //
    // calculate the functions nullable, firstpos, lastpos and followpos on
    // nodes in the parse tree.
    //    See the alogrithm description in Aho.
    //    Understanding how this works by looking at the code alone will be
    //       nearly impossible.
    //
    calcNullable(fTree);
    calcFirstPos(fTree);
    calcLastPos(fTree);
    calcFollowPos(fTree);
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "pos")) {
        RBBIDebugPuts("\n");
        printPosSets(fTree);
    }

    //
    //  For "chained" rules, modify the followPos sets
    //
    if (fRB->fChainRules) {
        calcChainedFollowPos(fTree);
    }

    //
    //  BOF (start of input) test fixup.
    //
    if (fRB->fSetBuilder->sawBOF()) {
        bofFixup();
    }

    //
    // Build the DFA state transition tables.
    //
    buildStateTable();
    flagAcceptingStates();
    flagLookAheadStates();
    flagTaggedStates();

    //
    // Update the global table of rule status {tag} values
    // The rule builder has a global vector of status values that are common
    //    for all tables.  Merge the ones from this table into the global set.
    //
    mergeRuleStatusVals();
}